

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

QByteArray * QSslCertificatePrivate::subjectInfoToString(SubjectInfo info)

{
  undefined4 in_ESI;
  QByteArray *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 1:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 2:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 3:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 4:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 5:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 6:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 7:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 8:
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  default:
    QByteArray::QByteArray((QByteArray *)0x26efd7);
  }
  return in_RDI;
}

Assistant:

QByteArray QSslCertificatePrivate::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    switch (info) {
    case QSslCertificate::Organization: return "O"_ba;
    case QSslCertificate::CommonName: return "CN"_ba;
    case QSslCertificate::LocalityName: return"L"_ba;
    case QSslCertificate::OrganizationalUnitName: return "OU"_ba;
    case QSslCertificate::CountryName: return "C"_ba;
    case QSslCertificate::StateOrProvinceName: return "ST"_ba;
    case QSslCertificate::DistinguishedNameQualifier: return "dnQualifier"_ba;
    case QSslCertificate::SerialNumber: return "serialNumber"_ba;
    case QSslCertificate::EmailAddress: return "emailAddress"_ba;
    }
    return QByteArray();
}